

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testzlib.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__s1;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ssh_decompressor *d;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  char *p;
  FILE *fp;
  char *filename;
  int opts;
  int noheader;
  ssh_decompressor *handle;
  int outlen;
  int ret;
  uchar *outbuf;
  uchar buf [16];
  char **argv_local;
  int argc_local;
  
  bVar2 = false;
  bVar1 = true;
  fp = (FILE *)0x0;
  buf._8_8_ = argv;
  argv_local._0_4_ = argc;
  while (argv_local._0_4_ = (int)argv_local + -1, (int)argv_local != 0) {
    lVar5 = buf._8_8_ + 8;
    __s1 = *(FILE **)(buf._8_8_ + 8);
    buf._8_8_ = lVar5;
    if (((char)__s1->_flags == '-') && (bVar1)) {
      iVar3 = strcmp((char *)__s1,"-d");
      if (iVar3 == 0) {
        bVar2 = true;
      }
      else {
        iVar3 = strcmp((char *)__s1,"--");
        if (iVar3 != 0) {
          iVar3 = strcmp((char *)__s1,"--help");
          if (iVar3 == 0) {
            printf("usage: testzlib          decode zlib (RFC1950) data from standard input\n");
            printf("       testzlib -d       decode Deflate (RFC1951) data from standard input\n");
            printf("       testzlib --help   display this text\n");
            return 0;
          }
          fprintf(_stderr,"unknown command line option \'%s\'\n",__s1);
          return 1;
        }
        bVar1 = false;
      }
    }
    else {
      bVar6 = fp != (FILE *)0x0;
      fp = __s1;
      if (bVar6) {
        fprintf(_stderr,"can only handle one filename\n");
        return 1;
      }
    }
  }
  d = ssh_decompressor_new(&ssh_zlib);
  if ((bVar2) &&
     (ssh_decompressor_decompress(d,main::ersatz_zlib_header,2,(uchar **)&outlen,(int *)&handle),
     (int)handle != 0)) {
    __assert_fail("outlen == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testzlib.c"
                  ,0x4e,"int main(int, char **)");
  }
  if (fp == (FILE *)0x0) {
    p = _stdin;
  }
  else {
    p = (char *)fopen((char *)fp,"rb");
  }
  if (p == (char *)0x0) {
    if (fp != (FILE *)0x0) {
      fprintf(_stderr,"unable to open \'%s\'\n",fp);
      return 1;
    }
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testzlib.c"
                  ,0x57,"int main(int, char **)");
  }
  while( true ) {
    sVar4 = fread(&outbuf,1,0x10,(FILE *)p);
    handle._4_4_ = (int)sVar4;
    if (handle._4_4_ < 1) {
      ssh_decompressor_free(d);
      if (fp != (FILE *)0x0) {
        fclose((FILE *)p);
      }
      return 0;
    }
    ssh_decompressor_decompress(d,(uchar *)&outbuf,handle._4_4_,(uchar **)&outlen,(int *)&handle);
    if (_outlen == (uchar *)0x0) break;
    if ((int)handle != 0) {
      fwrite(_outlen,1,(long)(int)handle,_stdout);
    }
    safefree(_outlen);
  }
  fprintf(_stderr,"decoding error\n");
  fclose((FILE *)p);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    unsigned char buf[16], *outbuf;
    int ret, outlen;
    ssh_decompressor *handle;
    int noheader = false, opts = true;
    char *filename = NULL;
    FILE *fp;

    while (--argc) {
        char *p = *++argv;

        if (p[0] == '-' && opts) {
            if (!strcmp(p, "-d")) {
                noheader = true;
            } else if (!strcmp(p, "--")) {
                opts = false;          /* next thing is filename */
            } else if (!strcmp(p, "--help")) {
                printf("usage: testzlib          decode zlib (RFC1950) data"
                       " from standard input\n");
                printf("       testzlib -d       decode Deflate (RFC1951) data"
                       " from standard input\n");
                printf("       testzlib --help   display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else if (!filename) {
            filename = p;
        } else {
            fprintf(stderr, "can only handle one filename\n");
            return 1;
        }
    }

    handle = ssh_decompressor_new(&ssh_zlib);

    if (noheader) {
        /*
         * Provide missing zlib header if -d was specified.
         */
        static const unsigned char ersatz_zlib_header[] = { 0x78, 0x9C };
        ssh_decompressor_decompress(
            handle, ersatz_zlib_header, sizeof(ersatz_zlib_header),
            &outbuf, &outlen);
        assert(outlen == 0);
    }

    if (filename)
        fp = fopen(filename, "rb");
    else
        fp = stdin;

    if (!fp) {
        assert(filename);
        fprintf(stderr, "unable to open '%s'\n", filename);
        return 1;
    }

    while (1) {
        ret = fread(buf, 1, sizeof(buf), fp);
        if (ret <= 0)
            break;
        ssh_decompressor_decompress(handle, buf, ret, &outbuf, &outlen);
        if (outbuf) {
            if (outlen)
                fwrite(outbuf, 1, outlen, stdout);
            sfree(outbuf);
        } else {
            fprintf(stderr, "decoding error\n");
            fclose(fp);
            return 1;
        }
    }

    ssh_decompressor_free(handle);

    if (filename)
        fclose(fp);

    return 0;
}